

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  pointer *ppoVar1;
  NetPrivate *pNVar2;
  pointer poVar3;
  iterator __position;
  pointer pcVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  overwrite_builtin_layer_registry_entry entry;
  value_type local_58;
  
  uVar6 = index & 0xfffffeff;
  if (uVar6 == index) {
    fprintf(_stderr,"overwrite built-in layer type %d",index);
    fputc(10,_stderr);
    pNVar2 = this->d;
    poVar3 = (pNVar2->overwrite_builtin_layer_registry).
             super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         (pNVar2->overwrite_builtin_layer_registry).
         super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)__position._M_current - (long)poVar3;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 5;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      lVar7 = 0;
      do {
        if (*(int *)((long)&poVar3->typeindex + lVar7) == index) {
          fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",index);
          fputc(10,_stderr);
          poVar3 = (this->d->overwrite_builtin_layer_registry).
                   super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(layer_creator_func *)((long)&poVar3->creator + lVar7) = creator;
          *(layer_destroyer_func *)((long)&poVar3->destroyer + lVar7) = destroyer;
          *(void **)((long)&poVar3->userdata + lVar7) = userdata;
          return 0;
        }
        lVar7 = lVar7 + 0x20;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    local_58.name = (char *)CONCAT44(local_58.name._4_4_,index);
    if (__position._M_current ==
        (pNVar2->overwrite_builtin_layer_registry).
        super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_58.creator = creator;
      local_58.destroyer = destroyer;
      local_58.userdata = userdata;
      std::
      vector<ncnn::overwrite_builtin_layer_registry_entry,std::allocator<ncnn::overwrite_builtin_layer_registry_entry>>
      ::_M_realloc_insert<ncnn::overwrite_builtin_layer_registry_entry_const&>
                ((vector<ncnn::overwrite_builtin_layer_registry_entry,std::allocator<ncnn::overwrite_builtin_layer_registry_entry>>
                  *)&pNVar2->overwrite_builtin_layer_registry,__position,
                 (overwrite_builtin_layer_registry_entry *)&local_58);
    }
    else {
      (__position._M_current)->destroyer = destroyer;
      (__position._M_current)->userdata = userdata;
      *(char **)__position._M_current = local_58.name;
      (__position._M_current)->creator = creator;
      ppoVar1 = &(pNVar2->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppoVar1 = *ppoVar1 + 1;
    }
  }
  else {
    pNVar2 = this->d;
    pcVar4 = (pNVar2->custom_layer_registry).
             super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pNVar2->custom_layer_registry).
                            super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) >> 5) <=
        (int)uVar6) {
      local_58.destroyer = (layer_destroyer_func)0x0;
      local_58.userdata = (void *)0x0;
      local_58.name = "";
      local_58.creator = (layer_creator_func)0x0;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize(&pNVar2->custom_layer_registry,(long)(int)(uVar6 + 1),&local_58);
      pcVar4 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pcVar4[(int)uVar6].creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d",(ulong)uVar6);
      fputc(10,_stderr);
      pcVar4 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pcVar4[(int)uVar6].creator = creator;
    pcVar4[(int)uVar6].destroyer = destroyer;
    pcVar4[(int)uVar6].userdata = userdata;
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("overwrite built-in layer type %d", index);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == index)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", index);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {index, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}